

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::PushColumnClipRect(int column_index)

{
  ImGuiColumns *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumnData *pIVar3;
  ImGuiColumnData *column;
  ImGuiColumns *columns;
  ImGuiWindow *window;
  int column_index_local;
  
  pIVar2 = GetCurrentWindowRead();
  pIVar1 = (pIVar2->DC).CurrentColumns;
  window._4_4_ = column_index;
  if (column_index < 0) {
    window._4_4_ = pIVar1->Current;
  }
  pIVar3 = ImVector<ImGuiColumnData>::operator[](&pIVar1->Columns,window._4_4_);
  PushClipRect(&(pIVar3->ClipRect).Min,&(pIVar3->ClipRect).Max,false);
  return;
}

Assistant:

void ImGui::PushColumnClipRect(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    if (column_index < 0)
        column_index = columns->Current;

    ImGuiColumnData* column = &columns->Columns[column_index];
    PushClipRect(column->ClipRect.Min, column->ClipRect.Max, false);
}